

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textreader.hpp
# Opt level: O2

void __thiscall TextReader::read_symbol(TextReader *this,char value)

{
  bool bVar1;
  allocator local_b2;
  allocator local_b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  bVar1 = is_symbol(this,value);
  if (bVar1) {
    skip_symbol(this);
    return;
  }
  std::__cxx11::string::string((string *)&local_70,"Expect \"",&local_b1);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_b0,'\x01');
  std::operator+(&local_50,&local_70,&local_b0);
  std::__cxx11::string::string((string *)&local_90,"\" symbol",&local_b2);
  std::operator+(&local_30,&local_50,&local_90);
  parse_error(this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_70);
  return;
}

Assistant:

inline void read_symbol(const char value) {
        if (is_symbol(value))
            skip_symbol();
        else
            parse_error(std::string("Expect \"") + std::string(1, value) + std::string("\" symbol"));
    }